

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

void * sx_os_dlopen(char *filepath)

{
  void *pvVar1;
  
  pvVar1 = (void *)dlopen(filepath,1);
  return pvVar1;
}

Assistant:

void* sx_os_dlopen(const char* filepath)
{
#if SX_PLATFORM_WINDOWS
    return (void*)LoadLibraryA(filepath);
#elif SX_PLATFORM_EMSCRIPTEN || SX_PLATFORM_PS4 || SX_PLATFORM_XBOXONE || SX_PLATFORM_WINRT
    sx_unused(filepath);
    return NULL;
#else
    return dlopen(filepath, RTLD_LOCAL | RTLD_LAZY);
#endif    // SX_PLATFORM_
}